

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_soc.c
# Opt level: O1

curl_socket_t tool_socket_open_mptcp_cb(void *clientp,curlsocktype purpose,curl_sockaddr *addr)

{
  int iVar1;
  
  iVar1 = 0x106;
  if (addr->protocol != 6) {
    iVar1 = addr->protocol;
  }
  iVar1 = socket(addr->family,addr->socktype,iVar1);
  return iVar1;
}

Assistant:

curl_socket_t tool_socket_open_mptcp_cb(void *clientp,
                                        curlsocktype purpose,
                                        struct curl_sockaddr *addr)
{
  int protocol = addr->protocol;

  (void)clientp;
  (void)purpose;

  if(protocol == IPPROTO_TCP)
#if defined(__linux__)
#  ifndef IPPROTO_MPTCP
#  define IPPROTO_MPTCP 262
#  endif
    protocol = IPPROTO_MPTCP;
#else
    return CURL_SOCKET_BAD;
#endif

  return socket(addr->family, addr->socktype, protocol);
}